

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_2760b7::readValidateFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo)

{
  int iVar1;
  int iVar2;
  Slice *pSVar3;
  char cVar4;
  int iVar5;
  undefined8 in_RAX;
  half *phVar6;
  half *phVar7;
  int *piVar8;
  half *phVar9;
  ulong uVar10;
  int pNbChannels;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  half *phVar14;
  long lVar15;
  int pWidth_local;
  int pHeight_local;
  undefined8 local_110;
  Array2D<Imath_3_2::half> lPixelsLeft;
  Array2D<Imath_3_2::half> lPixels;
  InputFile lFile;
  FrameBuffer lInputFrameBuffer;
  Slice local_68 [56];
  
  if (pImageType == IMAGE_TYPE_RGB) {
    pNbChannels = 3;
  }
  else {
    if (pImageType == IMAGE_TYPE_OTHER) {
      pNbChannels = 2;
      local_110 = CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)in_RAX >> 8),1));
      goto LAB_00192c0e;
    }
    pNbChannels = 4;
  }
  local_110 = (ulong)local_110._4_4_ << 0x20;
LAB_00192c0e:
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar15 = (long)pHeight;
  lVar12 = (long)(pWidth * pNbChannels);
  uVar10 = 0xffffffffffffffff;
  if (-1 < lVar12 * lVar15) {
    uVar10 = lVar12 * lVar15 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  phVar6 = (half *)operator_new__(uVar10);
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  lPixels._sizeX = lVar15;
  lPixels._sizeY = lVar12;
  lPixels._data = phVar6;
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    phVar7 = (half *)operator_new__(uVar10);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
    lPixelsLeft._sizeX = lVar15;
    lPixelsLeft._sizeY = lVar12;
    lPixelsLeft._data = phVar7;
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile(&lFile,pFilename,iVar5);
    Imf_3_2::InputFile::header();
    piVar8 = (int *)Imf_3_2::Header::dataWindow();
    iVar5 = piVar8[1];
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar10 = (ulong)(uint)(pNbChannels * 2);
    uVar11 = (long)((piVar8[2] - *piVar8) + 1) * uVar10;
    local_110 = (ulong)(uint)(pNbChannels * 8);
    uVar13 = 0;
    phVar9 = phVar7;
    phVar14 = phVar6;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar13);
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)phVar14,uVar10,uVar11,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + uVar13);
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)phVar9,uVar10,uVar11,1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      uVar13 = uVar13 + 8;
      phVar9 = phVar9 + 1;
      phVar14 = phVar14 + 1;
    } while (local_110 != uVar13);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::InputFile::readPixels((int)&lFile,iVar5);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile(&lFile);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
    validatePixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    operator_delete__(phVar7);
  }
  else {
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&lPixelsLeft,pFilename,iVar5);
    Imf_3_2::InputFile::header();
    piVar8 = (int *)Imf_3_2::Header::dataWindow();
    iVar5 = piVar8[1];
    iVar1 = piVar8[2];
    iVar2 = *piVar8;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar10 = 0;
    phVar7 = phVar6;
    lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lInputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + uVar10);
      Imf_3_2::Slice::Slice
                (local_68,HALF,(char *)phVar7,(ulong)(uint)(pNbChannels * 2),
                 (long)((iVar1 - iVar2) + 1) * (ulong)(uint)(pNbChannels * 2),1,1,
                 (double)*(float *)(_imath_half_to_float_table +
                                   (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4),false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lInputFrameBuffer,pSVar3);
      uVar10 = uVar10 + 8;
      phVar7 = phVar7 + 1;
    } while ((uint)(pNbChannels * 8) != uVar10);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&lPixelsLeft);
    cVar4 = Imf_3_2::InputFile::isOptimizationEnabled();
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization disabled\n",0x17);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," optimization enabled\n",0x16);
      if ((char)local_110 != '\0') {
        std::operator<<((ostream *)&std::cerr,
                        " error: isOptimizationEnabled returned TRUE, but optimization not known to work for two channel images\n"
                       );
        __assert_fail("pNbChannels != 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::readPixels(const char *, int, Array2D<half> &)");
      }
    }
    Imf_3_2::InputFile::readPixels((int)&lPixelsLeft,iVar5);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lInputFrameBuffer);
    Imf_3_2::InputFile::~InputFile((InputFile *)&lPixelsLeft);
    validatePixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  }
  operator_delete__(phVar6);
  return;
}

Assistant:

void
readValidateFile (
    const char pFilename[],
    int        pHeight,
    int        pWidth,
    EImageType pImageType,
    bool       pIsStereo)
{
    const int lNbChannels = getNbChannels (pImageType);

    Array2D<half> lPixels;
    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    //readPixels(pFilename, lNbChannels, lPixels);
    //writePixels("pkTest.exr", pHeight, pWidth, lPixels, lNbChannels, NO_COMPRESSION);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;
        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        readPixels (pFilename, lNbChannels, lPixels, lPixelsLeft);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
        validatePixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);
    }
    else
    {
        readPixels (pFilename, lNbChannels, lPixels);
        validatePixels (pHeight, pWidth, lPixels, lNbChannels, false);
    }
}